

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sl_serial.c
# Opt level: O1

slReturn autoBaudRate(int fdPort,int minBaud,baudRateSynchronizer *synchronizer,int verbosity)

{
  uint baud;
  bool bVar1;
  errInfo error;
  errInfo error_00;
  bool bVar2;
  _Bool _Var3;
  slReturn pvVar4;
  longlong lVar5;
  void *pvVar6;
  long lVar7;
  speedInfo si;
  slReturn local_e0;
  speedInfo local_bc;
  errorInfo_slReturn local_b0;
  errorInfo_slReturn local_90;
  errorInfo_slReturn local_70;
  errorInfo_slReturn local_50;
  
  pvVar4 = getSpeedInfo(fdPort,&local_bc);
  _Var3 = isErrorReturn(pvVar4);
  if (_Var3) {
    createErrorInfo(&local_50,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                    ,"autoBaudRate",0x12d,pvVar4);
    error.fileName._0_4_ = (int)local_50.fileName;
    error.cause = local_50.cause;
    error.fileName._4_4_ = (int)((ulong)local_50.fileName >> 0x20);
    error.functionName._0_4_ = (int)local_50.functionName;
    error.functionName._4_4_ = (int)((ulong)local_50.functionName >> 0x20);
    error.lineNumber = local_50.lineNumber;
    error._28_4_ = local_50._28_4_;
    local_e0 = makeErrorMsgReturn(error,"problem getting speed information");
  }
  else {
    lVar5 = max_ll(4000,(long)(local_bc.nsChar / 4000));
    if (2 < verbosity) {
      printf("Trying baud rates from 921600 to %d...\n",(ulong)(uint)minBaud);
    }
    lVar7 = 0;
    do {
      baud = *(uint *)((long)&DAT_00115b00 + lVar7);
      bVar1 = true;
      if ((int)baud < minBaud) break;
      if (1 < verbosity) {
        printf("Trying %d baud...\n",(ulong)baud);
      }
      pvVar4 = setTermOptionsBaud(fdPort,baud);
      _Var3 = isErrorReturn(pvVar4);
      if (_Var3) {
        createErrorInfo(&local_90,
                        "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                        ,"autoBaudRate",0x13c,pvVar4);
        bVar2 = false;
        local_e0 = makeErrorFmtMsgReturn(0x11599b,(char *)(ulong)baud);
      }
      else {
        pvVar4 = (*synchronizer)(fdPort,(int)lVar5,verbosity);
        _Var3 = isErrorReturn(pvVar4);
        if (_Var3) {
          createErrorInfo(&local_b0,
                          "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                          ,"autoBaudRate",0x141,pvVar4);
          error_00.fileName._0_4_ = (int)local_b0.fileName;
          error_00.cause = local_b0.cause;
          error_00.fileName._4_4_ = (int)((ulong)local_b0.fileName >> 0x20);
          error_00.functionName._0_4_ = (int)local_b0.functionName;
          error_00.functionName._4_4_ = (int)((ulong)local_b0.functionName >> 0x20);
          error_00.lineNumber = local_b0.lineNumber;
          error_00._28_4_ = local_b0._28_4_;
          local_e0 = makeErrorMsgReturn(error_00,"problem while synchronizing");
        }
        else {
          pvVar6 = getReturnInfo(pvVar4);
          if (pvVar6 == (void *)0x0) {
            bVar2 = true;
            goto LAB_0010a8a9;
          }
          if (1 < verbosity) {
            printf("Synchronized on %d baud...\n",(ulong)baud);
          }
          local_e0 = makeOkInfoReturn((void *)(long)(int)baud);
        }
        bVar2 = false;
      }
LAB_0010a8a9:
      if (!bVar2) {
        bVar1 = false;
        break;
      }
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x50);
    if (bVar1) {
      puts("Could not synchronize on any baud rate...");
      createErrorInfo(&local_70,
                      "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                      ,"autoBaudRate",0x148,(slReturn)0x0);
      local_e0 = makeErrorFmtMsgReturn(0x1159f9,(char *)(ulong)(uint)minBaud);
    }
  }
  return local_e0;
}

Assistant:

extern slReturn autoBaudRate( int fdPort, int minBaud, baudRateSynchronizer synchronizer, int verbosity ) {

    // we're going to allow 250 character times, or 4 seconds, whichever is greater...
    speedInfo si;
    // this code block is in the wrong place, IMHO, and should be in the loop below
    // However, a timeout of 4 seconds is OK for our purposes here, so I'm leaving it - PR
    slReturn gsiResp = getSpeedInfo( fdPort, &si );
    if( isErrorReturn( gsiResp ) )
        return makeErrorMsgReturn( ERR_CAUSE( gsiResp ), "problem getting speed information" );
    int maxMs = (int) max_ll( 4000, si.nsChar * 250 / 1000000 );

    int bauds[] = { 921600, 460800, 230400, 115200, 57600, 38400, 19200, 9600, 4800, 2400,
                    1800, 1200, 600, 300, 200, 150, 134, 110, 75, 50   };

    if( verbosity >= 3 ) printf( "Trying baud rates from 921600 to %d...\n", minBaud );

    for( int i = 0; (i < ARRAY_SIZE( bauds ) ) && (bauds[i] >= minBaud); i++ ) {

        if( verbosity >= 2 ) printf( "Trying %d baud...\n", bauds[i] );

        // set the baud rate for the current attempt...
        slReturn stobResp = setTermOptionsBaud( fdPort, bauds[i] );
        if( isErrorReturn( stobResp ) )
            return makeErrorFmtMsgReturn( ERR_CAUSE( stobResp ), "problem trying to set baud rate to %d", bauds[i] );

        // try to synchronize on it...
        slReturn syncResp = synchronizer( fdPort, maxMs, verbosity );
        if( isErrorReturn( syncResp ) )
            return makeErrorMsgReturn( ERR_CAUSE( syncResp ), "problem while synchronizing" );
        if( getReturnInfoBool( syncResp ) ) {
            if( verbosity >= 2 ) printf( "Synchronized on %d baud...\n", bauds[i] );
            return makeOkInfoReturn(int2info( bauds[i] ));
        }
    }
    printf( "Could not synchronize on any baud rate...\n" );
    return makeErrorFmtMsgReturn( ERR_ROOT, "could not synchronize at any baud rate from 921600 to %d", minBaud );
}